

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::extract_binary_string(string *__return_storage_ptr__,string *escaped_string)

{
  char hc;
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  sVar1 = escaped_string->_M_string_length;
  iVar3 = ::std::__cxx11::string::compare((ulong)escaped_string,0,(char *)0x3);
  if (iVar3 == 0) {
    lVar7 = 2;
    iVar3 = ::std::__cxx11::string::compare((ulong)escaped_string,sVar1 - 2,(char *)0x2);
    if (iVar3 == 0) {
      uVar8 = 3;
      goto LAB_0012ba8a;
    }
  }
  uVar8 = 4;
  iVar3 = ::std::__cxx11::string::compare((ulong)escaped_string,0,(char *)0x4);
  if ((iVar3 != 0) ||
     (iVar3 = ::std::__cxx11::string::compare((ulong)escaped_string,sVar1 - 3,(char *)0x3),
     lVar7 = 3, iVar3 != 0)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)escaped_string);
    return __return_storage_ptr__;
  }
LAB_0012ba8a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  do {
    if (sVar1 - lVar7 <= uVar8) {
      return __return_storage_ptr__;
    }
    pcVar2 = (escaped_string->_M_dataplus)._M_p;
    if ((pcVar2[uVar8] == '\\') && ((byte)(pcVar2[uVar8 + 1] | 0x20U) == 0x78)) {
      hc = pcVar2[uVar8 + 3];
      uVar4 = hexConvert(pcVar2[uVar8 + 2]);
      uVar5 = hexConvert(hc);
      if (0xf < (uVar5 | uVar4)) goto LAB_0012bb21;
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar6 = 4;
    }
    else {
LAB_0012bb21:
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar6 = 1;
    }
    uVar8 = uVar8 + lVar6;
  } while( true );
}

Assistant:

CLI11_INLINE std::string extract_binary_string(const std::string &escaped_string) {
    std::size_t start{0};
    std::size_t tail{0};
    size_t ssize = escaped_string.size();
    if(escaped_string.compare(0, 3, "B\"(") == 0 && escaped_string.compare(ssize - 2, 2, ")\"") == 0) {
        start = 3;
        tail = 2;
    } else if(escaped_string.compare(0, 4, "'B\"(") == 0 && escaped_string.compare(ssize - 3, 3, ")\"'") == 0) {
        start = 4;
        tail = 3;
    }

    if(start == 0) {
        return escaped_string;
    }
    std::string outstring;

    outstring.reserve(ssize - start - tail);
    std::size_t loc = start;
    while(loc < ssize - tail) {
        // ssize-2 to skip )" at the end
        if(escaped_string[loc] == '\\' && (escaped_string[loc + 1] == 'x' || escaped_string[loc + 1] == 'X')) {
            auto c1 = escaped_string[loc + 2];
            auto c2 = escaped_string[loc + 3];

            std::uint32_t res1 = hexConvert(c1);
            std::uint32_t res2 = hexConvert(c2);
            if(res1 <= 0x0F && res2 <= 0x0F) {
                loc += 4;
                outstring.push_back(static_cast<char>(res1 * 16 + res2));
                continue;
            }
        }
        outstring.push_back(escaped_string[loc]);
        ++loc;
    }
    return outstring;
}